

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawData::Clear(ImDrawData *this)

{
  undefined1 *in_RDI;
  ImVec2 in_stack_fffffffffffffff0;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  ImVector<ImDrawList_*>::resize
            ((ImVector<ImDrawList_*> *)in_stack_fffffffffffffff0,(int)((ulong)in_RDI >> 0x20));
  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffff0,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x30) = in_stack_fffffffffffffff0;
  *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RDI + 0x30);
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RDI + 0x28);
  *(undefined8 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

void ImDrawData::Clear()
{
    Valid = false;
    CmdListsCount = TotalIdxCount = TotalVtxCount = 0;
    CmdLists.resize(0); // The ImDrawList are NOT owned by ImDrawData but e.g. by ImGuiContext, so we don't clear them.
    DisplayPos = DisplaySize = FramebufferScale = ImVec2(0.0f, 0.0f);
    OwnerViewport = NULL;
}